

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::DeliveryChannel::postNextTimer(DeliveryChannel *this)

{
  QueueNode *__d;
  uint64_t uVar1;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RDI;
  int64_t deltaUsec;
  uint64_t nowUsec;
  uint64_t aheadUsec;
  QueueNode *frontNode;
  Locker locker;
  uint64_t nextTimerWakeUsec;
  Lock *in_stack_ffffffffffffff88;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa0;
  duration *in_stack_ffffffffffffffa8;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_ffffffffffffffb0;
  unsigned_long local_38;
  int local_30;
  QueueNode *local_20;
  uint64_t local_10;
  
  local_10 = 0;
  Locker::Locker((Locker *)in_RDI,in_stack_ffffffffffffff88);
  __d = PacketQueue::Peek((PacketQueue *)(in_RDI + 2));
  if (__d == (QueueNode *)0x0) {
    local_30 = 1;
  }
  else {
    local_10 = __d->DeliveryUsec;
    if ((*(long *)&in_RDI[2].
                   super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                   .implementation_.might_have_pending_waits == 0) ||
       ((long)(local_10 -
              *(long *)&in_RDI[2].
                        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                        .implementation_.might_have_pending_waits) < 0)) {
      *(uint64_t *)
       &in_RDI[2].
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        .implementation_.might_have_pending_waits = local_10;
      local_30 = 0;
    }
    else {
      local_30 = 1;
    }
  }
  local_20 = __d;
  Locker::~Locker((Locker *)0x267f18);
  if (local_30 == 0) {
    local_38 = 0;
    uVar1 = GetTimeUsec();
    if (0 < (long)(local_10 - uVar1)) {
      local_38 = local_10 - uVar1;
    }
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::operator->((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  *)0x267f65);
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
              ((duration<long,std::ratio<1l,1000000l>> *)&stack0xffffffffffffffa8,&local_38);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<long,std::ratio<1l,1000000l>,void>
              (in_stack_ffffffffffffffa0,(duration<long,_std::ratio<1L,_1000000L>_> *)__d);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::expires_after(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::operator->((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  *)0x267f9f);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
    ::async_wait<mau::DeliveryChannel::postNextTimer()::__0>(in_RDI,(anon_class_8_1_8991fb9c *)__d);
  }
  return;
}

Assistant:

void DeliveryChannel::postNextTimer()
{
    uint64_t nextTimerWakeUsec = 0;

    {
        Locker locker(QueueLock);

        // Read next target wake time
        QueueNode* frontNode = Queue.Peek();
        if (!frontNode) {
            // No data in the queue
            return;
        }

        nextTimerWakeUsec = frontNode->DeliveryUsec;

        // If we are already waiting for an earlier (or same) time:
        if (NextTimerWakeUsec != 0 &&
            (int64_t)(nextTimerWakeUsec - NextTimerWakeUsec) >= 0)
        {
            // Current wake-up time is sooner
            return;
        }

        NextTimerWakeUsec = nextTimerWakeUsec;
    }

    // Calculate when the timer should fire
    uint64_t aheadUsec = 0;
    const uint64_t nowUsec = GetTimeUsec();
    const int64_t deltaUsec = (int64_t)(nextTimerWakeUsec - nowUsec);
    if (deltaUsec > 0) {
        aheadUsec = deltaUsec;
    }

    //Common->Logger.Info("Waiting for ", aheadUsec, " usec");

    // Update timer to new time
    DeliveryTimer->expires_after(std::chrono::microseconds(aheadUsec));

    DeliveryTimer->async_wait(([this](const asio::error_code& error)
    {
        // Clear the next wakeup time to allow the next one to be set
        // concurrently (see above)
        {
            Locker locker(QueueLock);
            NextTimerWakeUsec = 0;
        }

        if (error)
        {
            // Do not report errors here.
            // They happen normally as we cancel and restart the timers
            // to wake them up sooner
            //ModuleLogger.Warning("DeliveryChannel timer error: ", error.message());
            return;
        }

        UDPAddress destAddress = DeliveryAddress.Get();
        if (destAddress.address().is_unspecified())
        {
            Common->Logger.Info("Delivery address unspecified - Abort");
            return; // Still waiting for hostname resolution
        }

        QueueNode* node;
        const uint64_t nowUsec = GetTimeUsec();

        for (;;)
        {
            {
                Locker locker(QueueLock);

                node = Queue.Peek();
                if (!node) {
                    break;
                }

                if ((int64_t)(nowUsec - node->DeliveryUsec) < 0) {
                    break;
                }

                Queue.Pop();
            }

            //Common->Logger.Info("Forwarding at ", node->TargetDeliveryUsec, " off by ", (int64_t)(nowUsec - node->TargetDeliveryUsec));

            void* nodeData = &node->Data[0];

            if (Common->ProxyConfig.SendHook)
            {
                Common->ProxyConfig.SendHook(
                    Common->ProxyConfig.SendHookContext,
                    destAddress.port(),
                    nodeData,
                    node->Bytes
                );

                Common->ReadBufferAllocator.Free(node);
            }
            else
            {
                Common->Socket->async_send_to(
                    asio::buffer(nodeData, node->Bytes),
                    destAddress, [this, node](const asio::error_code&, std::size_t)
                {
                    Common->ReadBufferAllocator.Free(node);
                });
            }
        }

        postNextTimer();
    }));
}